

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btAlignedObjectArray<int>_>::resize
          (btAlignedObjectArray<btAlignedObjectArray<int>_> *this,int newsize,
          btAlignedObjectArray<int> *fillData)

{
  int iVar1;
  int in_ESI;
  btAlignedObjectArray<btAlignedObjectArray<int>_> *in_RDI;
  int i_1;
  int i;
  int curSize;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar1 = size(in_RDI);
  iVar2 = in_ESI;
  if (in_ESI < iVar1) {
    for (; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x2646eb);
    }
  }
  else {
    iVar2 = iVar1;
    if (iVar1 < in_ESI) {
      reserve((btAlignedObjectArray<btAlignedObjectArray<int>_> *)
              CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
      iVar2 = iVar1;
    }
    for (; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      btAlignedObjectArray<int>::btAlignedObjectArray
                ((btAlignedObjectArray<int> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                 (btAlignedObjectArray<int> *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    }
  }
  in_RDI->m_size = in_ESI;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}